

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall
groundupdbext::EmbeddedDatabase::Impl::indexForBucket(Impl *this,HashedValue *key,string *bucket)

{
  KeyValueStore *pKVar1;
  Set this_00;
  size_t length;
  size_t hash;
  Set keys;
  undefined4 local_c4;
  EncodedValue local_c0;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_80;
  size_t local_68;
  EncodedValue idxKey;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 "bucket::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bucket);
  groundupdb::EncodedValue::EncodedValue(&idxKey,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  pKVar1 = (this->m_indexStore)._M_t.
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  groundupdb::HashedValue::HashedValue((HashedValue *)&local_c0,&idxKey);
  (*(pKVar1->super_Store)._vptr_Store[5])(&keys,pKVar1,&local_c0);
  groundupdb::HashedValue::~HashedValue((HashedValue *)&local_c0);
  this_00 = keys;
  groundupdb::HashedValue::data((Bytes *)&local_80,key);
  length = groundupdb::HashedValue::length(key);
  hash = groundupdb::HashedValue::hash(key);
  groundupdb::EncodedValue::EncodedValue(&local_c0,KEY,(Bytes *)&local_80,length,hash);
  std::
  _Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::find((_Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          *)this_00._M_t.
            super___uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
            .
            super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
            ._M_head_impl,&local_c0);
  groundupdb::HashedValue::~HashedValue(&local_c0.m_value);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_80);
  local_c4 = 1;
  groundupdb::HashedValue::data((Bytes *)&local_c0,key);
  local_80._M_impl.super__Vector_impl_data._M_start = (pointer)groundupdb::HashedValue::length(key);
  local_68 = groundupdb::HashedValue::hash(key);
  std::
  _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_emplace<groundupdb::Type,std::vector<std::byte,std::allocator<std::byte>>const,unsigned_long,unsigned_long>
            ((_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)keys._M_t.
                super___uniq_ptr_impl<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
                .
                super__Head_base<0UL,_std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_*,_false>
                ._M_head_impl,&local_c4,&local_c0,&local_80);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&local_c0);
  pKVar1 = (this->m_indexStore)._M_t.
           super___uniq_ptr_impl<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::KeyValueStore_*,_std::default_delete<groundupdb::KeyValueStore>_>
           .super__Head_base<0UL,_groundupdb::KeyValueStore_*,_false>._M_head_impl;
  groundupdb::HashedValue::HashedValue((HashedValue *)&local_c0,&idxKey);
  (*(pKVar1->super_Store)._vptr_Store[4])(pKVar1,&local_c0,&keys);
  groundupdb::HashedValue::~HashedValue((HashedValue *)&local_c0);
  std::
  unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
  ::~unique_ptr(&keys);
  groundupdb::HashedValue::~HashedValue(&idxKey.m_value);
  return;
}

Assistant:

void EmbeddedDatabase::Impl::indexForBucket(const HashedValue& key,const std::string& bucket) {
  // Add to bucket index
  EncodedValue idxKey("bucket::" + bucket);
  // query the key index
  //std::cout << "indexForBucket Fetching key set" << std::endl;
  Set keys = m_indexStore->getKeyValueSet(idxKey);
  //std::cout << "indexForBucket size currently: " << keys->size() << std::endl;
  //for (auto kiter = keys->begin();kiter != keys->end();kiter++) {
  //  std::cout << "  EncodedValue has value?: " << kiter->hasValue() << ", length: " << kiter->length() << ", hash: " << kiter->hash() << std::endl;
  //}
  //std::cout << "indexForBucket adding key" << std::endl;
  auto found = keys->find(EncodedValue(groundupdb::Type::KEY,key.data(),key.length(),key.hash()));
  //if (found != keys->end()) {
  //  std::cout << "WARNING: Specified value already exists in the set" << std::endl;
  //}
  keys->emplace(groundupdb::Type::KEY,key.data(),key.length(),key.hash());
  //std::cout << "indexForBucket size will now be: " << keys->size() << std::endl;
  //for (auto kiter = keys->begin();kiter != keys->end();kiter++) {
  //  std::cout << "  Now EncodedValue has value?: " << kiter->hasValue() << ", length: " << kiter->length() << ", hash: " << kiter->hash() << std::endl;
  //}
  //std::cout << "indexForBucket Setting kv" << std::endl;
  m_indexStore->setKeyValue(idxKey,std::move(keys)); // TODO do we need this? Yes - may not be in memory store
  // TODO replace the above with appendKeyValue(key,value)
}